

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O1

int Doolittle64(uchar *mat,int *pivot,int n)

{
  ulong uVar1;
  ulong uVar2;
  char cVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  int j;
  uint uVar18;
  uchar *puVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  byte bVar24;
  ulong uVar25;
  ulong uVar26;
  uint local_ac;
  uchar *local_90;
  ulong local_88;
  ulong local_60;
  
  iVar20 = n + 0x3f;
  iVar12 = n + 7;
  if (-1 < n) {
    iVar20 = n;
    iVar12 = n;
  }
  uVar6 = n - 1;
  lVar4 = (long)(iVar12 >> 3);
  uVar21 = iVar20 >> 6;
  lVar5 = (long)(int)uVar21;
  local_88 = 0;
  uVar13 = 0;
  if (0 < (int)uVar6) {
    uVar13 = (ulong)uVar6;
  }
  local_90 = mat + lVar5 * 8;
  local_60 = 1;
  local_ac = 0x11;
  uVar10 = 0;
  while( true ) {
    if (uVar10 == uVar13) {
      pivot[(int)uVar6] = uVar6;
      iVar12 = n + 7;
      if (-1 < n) {
        iVar12 = n;
      }
      return (mat[(long)((iVar12 >> 3) * n) + -1] & 1) - 1;
    }
    uVar9 = (uint)uVar10;
    pivot[uVar10] = uVar9;
    uVar1 = uVar10 + 1;
    if (uVar1 < (uint)n) {
      uVar16 = uVar10 >> 3 & 0x1fffffff;
      puVar19 = local_90;
      uVar25 = uVar1;
      do {
        uVar26 = (ulong)(((~(uint)mat[uVar16 + uVar10 * lVar4] & (uint)mat[uVar25 * lVar4 + uVar16])
                          >> (~uVar9 & 7) & 1) != 0);
        uVar17 = -uVar26;
        if (0x3f < n) {
          uVar23 = 0;
          do {
            uVar2 = *(ulong *)(puVar19 + uVar23 * 8);
            *(ulong *)(puVar19 + uVar23 * 8) =
                 *(ulong *)(mat + uVar23 * 8 + local_88 * 8) & uVar17 | uVar2 & uVar26 - 1;
            *(ulong *)(mat + uVar23 * 8 + local_88 * 8) =
                 uVar2 & uVar17 | *(ulong *)(mat + uVar23 * 8 + local_88 * 8) & uVar26 - 1;
            uVar23 = uVar23 + 1;
          } while (uVar21 != uVar23);
        }
        uVar11 = 0;
        if (uVar26 == 0) {
          uVar11 = pivot[uVar10];
        }
        pivot[uVar10] = (uint)uVar17 & (uint)uVar25 | uVar11;
        uVar25 = uVar25 + 1;
        puVar19 = puVar19 + lVar5 * 8;
      } while (uVar25 < (ulong)(long)n);
    }
    iVar20 = uVar9 * n;
    iVar12 = iVar20 + 7;
    if (-1 < iVar20) {
      iVar12 = iVar20;
    }
    uVar11 = (uint)(uVar10 >> 3) & 0x1fffffff;
    uVar15 = 1 << (sbyte)(~uVar9 & 7) & (uint)mat[(int)((iVar12 >> 3) + uVar11)];
    if (uVar15 == 0) break;
    if ((long)uVar1 < (long)n) {
      uVar7 = (uint)uVar1 & 7;
      uVar16 = uVar1 >> 3 & 0x1fffffff;
      cVar3 = (char)(0x100 >> (sbyte)uVar7);
      uVar7 = (uVar9 - uVar7) + 9;
      uVar25 = local_60;
      do {
        iVar20 = (int)uVar25 * n;
        iVar12 = iVar20 + 7;
        if (-1 < iVar20) {
          iVar12 = iVar20;
        }
        uVar17 = -(ulong)((mat[(int)((iVar12 >> 3) + uVar11)] >> (~uVar9 & 7) & 1) != 0);
        lVar14 = uVar25 * lVar4;
        bVar24 = (byte)uVar17;
        mat[lVar14 + uVar16] =
             (mat[uVar16 + uVar10 * lVar4] & bVar24 ^ mat[lVar14 + uVar16]) & cVar3 - 1U |
             mat[lVar14 + uVar16] & -cVar3;
        uVar18 = uVar7;
        uVar22 = local_ac & 0xfffffff8;
        if ((uVar7 & 0x3f) != 0 && (int)uVar7 < n) {
          do {
            uVar8 = uVar18 + 7;
            if (-1 < (int)uVar18) {
              uVar8 = uVar18;
            }
            mat[((int)uVar8 >> 3) + lVar14] =
                 mat[((int)uVar8 >> 3) + lVar14] ^
                 mat[(long)((int)uVar8 >> 3) + uVar10 * lVar4] & bVar24;
            uVar18 = uVar18 + 8;
          } while (((int)uVar22 < n) && (uVar8 = uVar22 & 0x3f, uVar22 = uVar22 + 8, uVar8 != 0));
        }
        if ((int)uVar18 < n) {
          do {
            uVar22 = uVar18 + 0x3f;
            if (-1 < (int)uVar18) {
              uVar22 = uVar18;
            }
            *(ulong *)(mat + (long)((int)uVar22 >> 6) * 8 + uVar25 * lVar5 * 8) =
                 *(ulong *)(mat + (long)((int)uVar22 >> 6) * 8 + uVar25 * lVar5 * 8) ^
                 *(ulong *)(mat + (long)((int)uVar22 >> 6) * 8 + uVar10 * lVar5 * 8) & uVar17;
            uVar18 = uVar18 + 0x40;
          } while ((int)uVar18 < n);
        }
        uVar25 = uVar25 + 1;
      } while (uVar25 != (uint)n);
    }
    local_60 = local_60 + 1;
    local_88 = (ulong)((int)local_88 + uVar21);
    local_90 = local_90 + lVar5 * 8;
    local_ac = local_ac + 1;
    uVar10 = uVar1;
    if (uVar15 == 0) {
      return -1;
    }
  }
  return -1;
}

Assistant:

int Doolittle64(unsigned char *mat, int *pivot, int n)
{
  uint64_t *mat_64_ptr = (uint64_t*)mat;

  for(int k = 0; k < n-1; k++)
  {

    /*
     * swap rows in constant time ...
     */

    pivot[k] = k;

    uint64_t tmp;
    for(uint64_t j = k+1; j < n; j++)
    {
      uint64_t mask_cpy = (mat[(n/8)*j + k/8] >> (7 - (k % 8))) & 1; // note: type has to be large enough to use as mask with j in pivot computing
      mask_cpy = mask_cpy & !((mat[(n/8)*k + k/8] >> (7 - (k % 8))) & 1);  // add this in order to only actually switch with the first suitable row => consistent with "ref" non-constant-time impl
      mask_cpy = -mask_cpy;
      for(int c = 0; c < n/64; c++)
      {
        // copy in 32 bit chunks
        tmp = mat_64_ptr[(n/64)*j + c];
        mat_64_ptr[(n/64)*j + c] = (mat_64_ptr[(n/64)*j + c] & ~mask_cpy) | (mat_64_ptr[(n/64)*k + c] & mask_cpy);
        mat_64_ptr[(n/64)*k + c] = (mat_64_ptr[(n/64)*k + c] & ~mask_cpy) | (tmp & mask_cpy);
      }

      // update pivot
      pivot[k] = (j & mask_cpy) | (pivot[k] & ~mask_cpy);
    }

    if (!((mat[k*n/8 + (k/8)] >> (7 - (k % 8))) & 1))
    {
      return -1;
    }

    for(int i = k+1; i < n; i++)
    {
      // 0x00 iff A(i,k) is zero. Otherweise 0xFF
      uint64_t mask_ik = 0x0000000000000000 - ((mat[i*n/8 + (k/8)] >> (7 - (k % 8))) & 1);

      /*
       * First, handle the case that j = k+1 is not divisible by 8; i.e. only handle the last j%8 bits of this byte
       */
      unsigned char mask_prepending = (unsigned char) (0x100 >> ((k+1) % 8)) - 1;

      unsigned char tmp = mat[n/8*i + (k+1)/8] & ~mask_prepending; // store the left side of the splitted byte in tmp
      mat[i*(n/8) + (k+1)/8]  ^= (mask_ik & mat[k*(n/8) + (k+1)/8]);

      // restore the left bits: first set bits 0, then 'or' tmp
      mat[n/8*i + (k+1)/8] &= mask_prepending;
      mat[n/8*i + (k+1)/8] |= tmp;

      // handle byte-aligned chunks until we are 8-byte aligned
      int k_1_aligned = k+1 + (8-((k+1)%8));
      int k_8_aligned = k_1_aligned;
      for(int j = k_1_aligned; (j < n) && ((j%64) != 0); j += 8)
      {
        mat[i*(n/8) + j/8] ^= mask_ik & mat[k*(n/8) + j/8];
        k_8_aligned = j+8;
      }

      /*
       * now handle the rest of the row efficiently in 4-byte-aligned byte-chunks
       */
      for(int j = k_8_aligned; j < n; j += 64)
      {
        mat_64_ptr[i*(n/64) + j/64] ^= mask_ik & mat_64_ptr[k*(n/64) + j/64];
      }
    }
  }
  pivot[n-1] = n-1;

  if ((mat[(n/8)*(n-1) + n/8-1] & 0x01) == 0)
  {
    return -1;
  }
  return 0;
}